

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  char *__assertion;
  value_type vVar1;
  average<double,_4UL> filter;
  
  filter.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.data =
       (pointer)&filter;
  filter.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.size = 0;
  filter.super_circular_array<double,_4UL>.super_circular_view<double,_4UL>.member.next = 4;
  filter.sum = 0.0;
  vista::circular::example::average<double,_4UL>::push(&filter,11.0);
  vVar1 = vista::circular::example::average<double,_4UL>::mean(&filter);
  if ((vVar1 != 11.0) || (NAN(vVar1))) {
    __assertion = "filter.mean() == 11.0";
    __line = 0x13;
  }
  else {
    vista::circular::example::average<double,_4UL>::push(&filter,22.0);
    vVar1 = vista::circular::example::average<double,_4UL>::mean(&filter);
    if ((vVar1 != 16.5) || (NAN(vVar1))) {
      __assertion = "filter.mean() == (11.0 + 22.0) / 2.0";
      __line = 0x16;
    }
    else {
      vista::circular::example::average<double,_4UL>::push(&filter,33.0);
      vVar1 = vista::circular::example::average<double,_4UL>::mean(&filter);
      if ((vVar1 != 22.0) || (NAN(vVar1))) {
        __assertion = "filter.mean() == (11.0 + 22.0 + 33.0) / 3.0";
        __line = 0x19;
      }
      else {
        vista::circular::example::average<double,_4UL>::push(&filter,44.0);
        vVar1 = vista::circular::example::average<double,_4UL>::mean(&filter);
        if ((vVar1 != 27.5) || (NAN(vVar1))) {
          __assertion = "filter.mean() == (11.0 + 22.0 + 33.0 + 44.0) / 4.0";
          __line = 0x1c;
        }
        else {
          vista::circular::example::average<double,_4UL>::push(&filter,55.0);
          vVar1 = vista::circular::example::average<double,_4UL>::mean(&filter);
          if ((vVar1 == 38.5) && (!NAN(vVar1))) {
            return 0;
          }
          __assertion = "filter.mean() == (22.0 + 33.0 + 44.0 + 55.0) / 4.0";
          __line = 0x1f;
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/example/circular/average/main.cpp"
                ,__line,"int main()");
}

Assistant:

int main()
{
    vista::circular::example::average<double, 4> filter;

    filter.push(11.0);
    assert(filter.mean() == 11.0);

    filter.push(22.0);
    assert(filter.mean() == (11.0 + 22.0) / 2.0);

    filter.push(33.0);
    assert(filter.mean() == (11.0 + 22.0 + 33.0) / 3.0);

    filter.push(44.0);
    assert(filter.mean() == (11.0 + 22.0 + 33.0 + 44.0) / 4.0);

    filter.push(55.0);
    assert(filter.mean() == (22.0 + 33.0 + 44.0 + 55.0) / 4.0);

    return 0;
}